

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_context.cpp
# Opt level: O3

unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>,_true>
__thiscall
duckdb::ClientContext::PendingQueryInternal
          (ClientContext *this,ClientContextLock *lock,shared_ptr<duckdb::Relation,_true> *relation,
          bool allow_stream_result)

{
  _Head_base<0UL,_duckdb::QueryNode_*,_false> _Var1;
  QueryNode *pQVar2;
  int iVar3;
  Relation *pRVar4;
  pointer pSVar5;
  RelationStatement *this_00;
  undefined7 in_register_00000009;
  shared_ptr<duckdb::Relation,_true> *this_01;
  undefined1 in_R8B;
  shared_ptr<duckdb::Relation,_true> local_c0;
  undefined1 local_b0 [8];
  QueryNode *local_a8;
  _Head_base<0UL,_duckdb::SelectStatement_*,_false> local_a0;
  undefined1 local_98 [8];
  string query;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> local_70 [4];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  char local_40 [16];
  
  this_01 = (shared_ptr<duckdb::Relation,_true> *)CONCAT71(in_register_00000009,allow_stream_result)
  ;
  CleanupInternal((ClientContext *)lock,(ClientContextLock *)relation,(BaseQueryResult *)0x0,false);
  LOCK();
  *(undefined1 *)&lock[4].client_guard._M_device = 0;
  UNLOCK();
  query._M_dataplus._M_p = (pointer)&query.field_2;
  query._M_string_length = 0;
  query.field_2._M_local_buf[0] = '\0';
  if (*(char *)&lock[0x1c].client_guard._M_device == '\x01') {
    pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(this_01);
    Relation::ToString_abi_cxx11_((string *)&local_50,pRVar4);
    if ((char *)local_50._M_allocated_capacity != local_40) {
      operator_delete((void *)local_50._M_allocated_capacity);
    }
    pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(this_01);
    (*pRVar4->_vptr_Relation[5])(local_70,pRVar4);
    if (local_70[0]._M_head_impl != (RegisteredStateManager *)(local_70 + 2)) {
      operator_delete(local_70[0]._M_head_impl);
    }
    pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(this_01);
    iVar3 = (*pRVar4->_vptr_Relation[8])(pRVar4);
    if ((char)iVar3 != '\0') {
      local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)operator_new(0x80);
      *(undefined1 *)
       &(((enable_shared_from_this<duckdb::Relation> *)
         &(((SelectStatement *)
           local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           )->super_SQLStatement).type)->__weak_this_).internal.
        super___weak_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr = 1;
      ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)
      &(((SelectStatement *)
        local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       super_SQLStatement).stmt_location)->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (((shared_ptr<duckdb::ClientContextWrapper,_true> *)
       &(((SelectStatement *)
         local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->super_SQLStatement).stmt_length)->internal).
      super___shared_ptr<duckdb::ClientContextWrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).named_param_map._M_h._M_buckets =
           &(((SelectStatement *)
             local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->super_SQLStatement).named_param_map._M_h._M_single_bucket;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).named_param_map._M_h._M_bucket_count = 1;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).named_param_map._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).named_param_map._M_h._M_element_count = 0;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).named_param_map._M_h._M_rehash_policy._M_next_resize = 0;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).named_param_map._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).query._M_dataplus._M_p =
           (pointer)&(((SelectStatement *)
                      local_c0.internal.
                      super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                     super_SQLStatement).query.field_2;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).query._M_string_length = 0;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement).query.field_2._M_local_buf[0] = '\0';
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_SQLStatement)._vptr_SQLStatement = (_func_int **)&PTR__SelectStatement_01981db8;
      (((SelectStatement *)
       local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false> =
           (_Head_base<0UL,_duckdb::QueryNode_*,_false>)0x0;
      pRVar4 = shared_ptr<duckdb::Relation,_true>::operator->(this_01);
      (*pRVar4->_vptr_Relation[3])(&local_a8,pRVar4);
      pSVar5 = unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
               ::operator->((unique_ptr<duckdb::SelectStatement,_std::default_delete<duckdb::SelectStatement>,_true>
                             *)&local_c0);
      pQVar2 = local_a8;
      local_a8 = (QueryNode *)0x0;
      _Var1._M_head_impl =
           (pSVar5->node).
           super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
           super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
           super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl;
      (pSVar5->node).super_unique_ptr<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>.
      _M_t.super___uniq_ptr_impl<duckdb::QueryNode,_std::default_delete<duckdb::QueryNode>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::QueryNode_*,_std::default_delete<duckdb::QueryNode>_>.
      super__Head_base<0UL,_duckdb::QueryNode_*,_false>._M_head_impl = pQVar2;
      if (_Var1._M_head_impl != (QueryNode *)0x0) {
        (**(code **)((long)(_Var1._M_head_impl)->_vptr_QueryNode + 8))();
        if (local_a8 != (QueryNode *)0x0) {
          (*local_a8->_vptr_QueryNode[1])();
        }
      }
      local_a0._M_head_impl =
           (SelectStatement *)
           local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      RunStatementInternal
                ((ClientContext *)local_98,lock,(string *)relation,
                 (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true>
                  *)0x0,SUB81(&local_a0,0),
                 (optional_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::BoundParameterData>_>_>,_true>
                  )0x0,false);
      if (local_98 != (undefined1  [8])0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_98)->__weak_this_).
                    internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.
                  internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi)();
      }
      local_98 = (undefined1  [8])0x0;
      if (local_a0._M_head_impl != (SelectStatement *)0x0) {
        (*((local_a0._M_head_impl)->super_SQLStatement)._vptr_SQLStatement[1])();
      }
      local_a0._M_head_impl = (SelectStatement *)0x0;
      if (local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          != (element_type *)0x0) {
        (*(local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          )->_vptr_Relation[1])();
      }
    }
  }
  this_00 = (RelationStatement *)operator_new(0x88);
  local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (this_01->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (this_01->internal).super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi;
  if (local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  RelationStatement::RelationStatement(this_00,&local_c0);
  if (local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_c0.internal.super___shared_ptr<duckdb::Relation,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_1_ = in_R8B;
  local_b0 = (undefined1  [8])this_00;
  PendingQueryInternal
            (this,lock,
             (unique_ptr<duckdb::SQLStatement,_std::default_delete<duckdb::SQLStatement>,_true> *)
             relation,(PendingQueryParameters *)local_b0,SUB81(&local_c0,0));
  if (local_b0 != (undefined1  [8])0x0) {
    (*((SQLStatement *)local_b0)->_vptr_SQLStatement[1])();
  }
  local_b0 = (undefined1  [8])0x0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)query._M_dataplus._M_p != &query.field_2) {
    operator_delete(query._M_dataplus._M_p);
  }
  return (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         (unique_ptr<duckdb::PendingQueryResult,_std::default_delete<duckdb::PendingQueryResult>_>)
         this;
}

Assistant:

unique_ptr<PendingQueryResult> ClientContext::PendingQueryInternal(ClientContextLock &lock,
                                                                   const shared_ptr<Relation> &relation,
                                                                   bool allow_stream_result) {
	InitialCleanup(lock);

	string query;
	if (config.query_verification_enabled) {
		// run the ToString method of any relation we run, mostly to ensure it doesn't crash
		relation->ToString();
		relation->GetAlias();
		if (relation->IsReadOnly()) {
			// verify read only statements by running a select statement
			auto select = make_uniq<SelectStatement>();
			select->node = relation->GetQueryNode();
			RunStatementInternal(lock, query, std::move(select), false, nullptr);
		}
	}

	auto relation_stmt = make_uniq<RelationStatement>(relation);
	PendingQueryParameters parameters;
	parameters.allow_stream_result = allow_stream_result;
	return PendingQueryInternal(lock, std::move(relation_stmt), parameters);
}